

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_result_builder.hpp
# Opt level: O3

void __thiscall
Catch::ResultBuilder::useActiveException(ResultBuilder *this,Flags resultDisposition)

{
  int iVar1;
  IRegistryHub *pIVar2;
  undefined4 extraout_var;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  (this->m_assertionInfo).resultDisposition = resultDisposition;
  pIVar2 = getRegistryHub();
  iVar1 = (*pIVar2->_vptr_IRegistryHub[4])(pIVar2);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x10))
            (&local_38,(long *)CONCAT44(extraout_var,iVar1));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->m_stream,local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  (this->m_data).resultType = ThrewException;
  captureExpression(this);
  return;
}

Assistant:

void ResultBuilder::useActiveException( ResultDisposition::Flags resultDisposition ) {
        m_assertionInfo.resultDisposition = resultDisposition;
        m_stream.oss << Catch::translateActiveException();
        captureResult( ResultWas::ThrewException );
    }